

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O2

_Bool gen_branch(DisasContext_conflict12 *ctx,arg_b *a,TCGCond cond)

{
  TCGContext_conflict11 *s;
  target_ulong tVar1;
  undefined1 extraout_AL;
  TCGLabel *l;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uintptr_t o;
  uintptr_t o_1;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_riscv64(s);
  t = tcg_temp_new_i64(s);
  t_00 = tcg_temp_new_i64(s);
  gen_get_gpr(s,t,a->rs1);
  gen_get_gpr(s,t_00,a->rs2);
  tcg_gen_brcond_i64_riscv64(s,cond,t,t_00,l);
  gen_goto_tb(ctx,1,ctx->pc_succ_insn);
  gen_set_label(s,l);
  tVar1 = (ctx->base).pc_next;
  if (((ctx->misa & 4) == 0) && (((int)tVar1 + a->imm & 3U) != 0)) {
    gen_exception_inst_addr_mis(ctx);
  }
  else {
    gen_goto_tb(ctx,0,tVar1 + (long)a->imm);
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(t + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(t_00 + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static bool gen_branch(DisasContext *ctx, arg_b *a, TCGCond cond)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l = gen_new_label(tcg_ctx);
    TCGv source1, source2;
    source1 = tcg_temp_new(tcg_ctx);
    source2 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, source1, a->rs1);
    gen_get_gpr(tcg_ctx, source2, a->rs2);

    tcg_gen_brcond_tl(tcg_ctx, cond, source1, source2, l);
    gen_goto_tb(ctx, 1, ctx->pc_succ_insn);
    gen_set_label(tcg_ctx, l); /* branch taken */

    if (!has_ext(ctx, RVC) && ((ctx->base.pc_next + a->imm) & 0x3)) {
        /* misaligned */
        gen_exception_inst_addr_mis(ctx);
    } else {
        gen_goto_tb(ctx, 0, ctx->base.pc_next + a->imm);
    }
    ctx->base.is_jmp = DISAS_NORETURN;

    tcg_temp_free(tcg_ctx, source1);
    tcg_temp_free(tcg_ctx, source2);

    return true;
}